

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::initTest(TessellationShaderTCTEgl_TessLevel *this)

{
  _tests *this_00;
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  _test_descriptor test_tcs_tes_equal;
  _test_descriptor test_tes_fo;
  _test_descriptor test_tes_fe;
  _test_descriptor test_tes_equal;
  _test_descriptor test_tcs_tes_fe;
  _test_descriptor test_tcs_tes_fo;
  long lVar4;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar4 + 0x708))(1,&this->m_vao_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Could not generate vertex array object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xcb4);
    (**(code **)(lVar4 + 0xd8))(this->m_vao_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Error binding vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xcb7);
    (**(code **)(lVar4 + 0x868))
              ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
               &this->m_gl_max_tess_gen_level_value);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glGetIntegerv() for GL_MAX_TESS_GEN_LEVEL_EXT pname failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xcbc);
    test_tcs_tes_equal.vs_id = 0;
    test_tcs_tes_equal.inner_tess_levels_uniform_location = 0;
    test_tcs_tes_equal.outer_tess_levels_uniform_location = 0;
    test_tcs_tes_equal.fs_id = 0;
    test_tcs_tes_equal.po_id = 0;
    test_tcs_tes_equal.tcs_id = 0;
    test_tcs_tes_equal.tes_id = 0;
    test_tcs_tes_equal.type = TESSELLATION_TEST_TYPE_COUNT;
    test_tcs_tes_equal.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    test_tcs_tes_fe.vs_id = 0;
    test_tcs_tes_fe.inner_tess_levels_uniform_location = 0;
    test_tcs_tes_fe.outer_tess_levels_uniform_location = 0;
    test_tcs_tes_fe.fs_id = 0;
    test_tcs_tes_fe.po_id = 0;
    test_tcs_tes_fe.tcs_id = 0;
    test_tcs_tes_fe.tes_id = 0;
    test_tcs_tes_fe.type = TESSELLATION_TEST_TYPE_COUNT;
    test_tcs_tes_fe.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    test_tcs_tes_fo.vs_id = 0;
    test_tcs_tes_fo.inner_tess_levels_uniform_location = 0;
    test_tcs_tes_fo.outer_tess_levels_uniform_location = 0;
    test_tcs_tes_fo.fs_id = 0;
    test_tcs_tes_fo.po_id = 0;
    test_tcs_tes_fo.tcs_id = 0;
    test_tcs_tes_fo.tes_id = 0;
    test_tcs_tes_fo.type = TESSELLATION_TEST_TYPE_COUNT;
    test_tcs_tes_fo.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    test_tes_equal.vs_id = 0;
    test_tes_equal.inner_tess_levels_uniform_location = 0;
    test_tes_equal.outer_tess_levels_uniform_location = 0;
    test_tes_equal.fs_id = 0;
    test_tes_equal.po_id = 0;
    test_tes_equal.tcs_id = 0;
    test_tes_equal.tes_id = 0;
    test_tes_equal.type = TESSELLATION_TEST_TYPE_COUNT;
    test_tes_equal.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    test_tes_fe.vs_id = 0;
    test_tes_fe.inner_tess_levels_uniform_location = 0;
    test_tes_fe.outer_tess_levels_uniform_location = 0;
    test_tes_fe.fs_id = 0;
    test_tes_fe.po_id = 0;
    test_tes_fe.tcs_id = 0;
    test_tes_fe.tes_id = 0;
    test_tes_fe.type = TESSELLATION_TEST_TYPE_COUNT;
    test_tes_fe.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    test_tes_fo.vs_id = 0;
    test_tes_fo.inner_tess_levels_uniform_location = 0;
    test_tes_fo.outer_tess_levels_uniform_location = 0;
    test_tes_fo.fs_id = 0;
    test_tes_fo.po_id = 0;
    test_tes_fo.tcs_id = 0;
    test_tes_fo.tes_id = 0;
    test_tes_fo.type = TESSELLATION_TEST_TYPE_COUNT;
    test_tes_fo.vertex_spacing = TESSELLATION_SHADER_VERTEX_SPACING_COUNT;
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,&test_tcs_tes_equal,
                       TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,&test_tcs_tes_fe,
                       TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
    initTestDescriptor(this,TESSELLATION_TEST_TYPE_FIRST,&test_tcs_tes_fo,
                       TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
    uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar3 & 0x300) != 0) {
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&test_tes_equal,
                         TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&test_tes_fe,
                         TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
      initTestDescriptor(this,TESSELLATION_TEST_TYPE_TES,&test_tes_fo,
                         TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
    }
    this_00 = &this->m_tests;
    std::
    vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
    ::push_back(this_00,&test_tcs_tes_equal);
    std::
    vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
    ::push_back(this_00,&test_tcs_tes_fe);
    std::
    vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
    ::push_back(this_00,&test_tcs_tes_fo);
    uVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    if ((uVar3 & 0x300) != 0) {
      std::
      vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
      ::push_back(this_00,&test_tes_equal);
      std::
      vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
      ::push_back(this_00,&test_tes_fe);
      std::
      vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
      ::push_back(this_00,&test_tes_fo);
    }
    (**(code **)(lVar4 + 0x6c8))(1,&this->m_bo_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glGenBuffers() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xce3);
    (**(code **)(lVar4 + 0x40))(0x8c8e,this->m_bo_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindBuffer() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xce6);
    (**(code **)(lVar4 + 0x48))(0x8c8e,0,this->m_bo_id);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindBufferBase() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xce8);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_tcs_tes_equal,
             "Tessellation shader functionality not supported, skipping",
             (allocator<char> *)&test_tcs_tes_fe);
  tcu::NotSupportedError::NotSupportedError(this_01,(string *)&test_tcs_tes_equal);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTCTEgl_TessLevel::initTest()
{
	/* The test requires EXT_tessellation_shader */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value before we carry on */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve gen level */
	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &m_gl_max_tess_gen_level_value);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() for GL_MAX_TESS_GEN_LEVEL_EXT pname failed");

	/* Initialize test descriptors */
	_test_descriptor test_tcs_tes_equal;
	_test_descriptor test_tcs_tes_fe;
	_test_descriptor test_tcs_tes_fo;
	_test_descriptor test_tes_equal;
	_test_descriptor test_tes_fe;
	_test_descriptor test_tes_fo;

	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_equal, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_fe,
					   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
	initTestDescriptor(TESSELLATION_TEST_TYPE_TCS_TES, &test_tcs_tes_fo,
					   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_equal, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_fe,
						   TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN);
		initTestDescriptor(TESSELLATION_TEST_TYPE_TES, &test_tes_fo, TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD);
	}

	m_tests.push_back(test_tcs_tes_equal);
	m_tests.push_back(test_tcs_tes_fe);
	m_tests.push_back(test_tcs_tes_fo);
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		m_tests.push_back(test_tes_equal);
		m_tests.push_back(test_tes_fe);
		m_tests.push_back(test_tes_fo);
	}

	/* Generate and set up a buffer object we will use to hold XFBed data.
	 *
	 * NOTE: We do not set the buffer object's storage here because its size
	 *       is iteration-specific.
	 **/
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

	/* We're good to execute the test! */
}